

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeevents.cpp
# Opt level: O1

void __thiscall
YAML::NodeEvents::Emit(NodeEvents *this,node *node,EventHandler *handler,AliasManager *am)

{
  element_type *peVar1;
  element_type *peVar2;
  node *node_00;
  bool bVar3;
  anchor_t aVar4;
  element_type **ppeVar5;
  MapIter *pMVar6;
  value vVar7;
  const_node_iterator __begin2;
  const_node_iterator __end2;
  node_iterator_base<const_YAML::detail::node> local_70;
  const_node_iterator local_50;
  
  bVar3 = IsAliased(this,node);
  vVar7 = Undefined;
  if (bVar3) {
    aVar4 = AliasManager::LookupAnchor(am,node);
    if (aVar4 != 0) {
      local_70._0_8_ = (element_type *)0x0;
      local_70.m_seqIt._M_current = (node **)((ulong)local_70.m_seqIt._M_current._4_4_ << 0x20);
      (*handler->_vptr_EventHandler[5])(handler,&local_70,aVar4);
      return;
    }
    local_70._0_8_ =
         (node->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_70.m_seqIt._M_current = (node **)(am->m_curAnchor + 1);
    am->m_curAnchor = (anchor_t)local_70.m_seqIt._M_current;
    std::
    _Rb_tree<YAML::detail::node_ref_const*,std::pair<YAML::detail::node_ref_const*const,unsigned_long>,std::_Select1st<std::pair<YAML::detail::node_ref_const*const,unsigned_long>>,std::less<YAML::detail::node_ref_const*>,std::allocator<std::pair<YAML::detail::node_ref_const*const,unsigned_long>>>
    ::_M_emplace_unique<std::pair<YAML::detail::node_ref_const*,unsigned_long>>
              ((_Rb_tree<YAML::detail::node_ref_const*,std::pair<YAML::detail::node_ref_const*const,unsigned_long>,std::_Select1st<std::pair<YAML::detail::node_ref_const*const,unsigned_long>>,std::less<YAML::detail::node_ref_const*>,std::allocator<std::pair<YAML::detail::node_ref_const*const,unsigned_long>>>
                *)am,(pair<const_YAML::detail::node_ref_*,_unsigned_long> *)&local_70);
    aVar4 = AliasManager::LookupAnchor(am,node);
  }
  else {
    aVar4 = 0;
  }
  peVar1 = (node->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2 = (peVar1->m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar2->m_isDefined != false) {
    vVar7 = peVar2->m_type;
  }
  switch(vVar7) {
  case Null:
    local_70._0_8_ = (element_type *)0x0;
    local_70.m_seqIt._M_current = (node **)((ulong)local_70.m_seqIt._M_current._4_4_ << 0x20);
    (*handler->_vptr_EventHandler[4])(handler,&local_70,aVar4);
    return;
  case Scalar:
    local_70._0_8_ = (element_type *)0x0;
    local_70.m_seqIt._M_current = (node **)((ulong)local_70.m_seqIt._M_current._4_4_ << 0x20);
    peVar2 = (peVar1->m_pData).
             super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*handler->_vptr_EventHandler[6])(handler,&local_70,&peVar2->m_tag,aVar4,&peVar2->m_scalar);
    return;
  case Sequence:
    local_70._0_8_ = (element_type *)0x0;
    local_70.m_seqIt._M_current = (node **)((ulong)local_70.m_seqIt._M_current._4_4_ << 0x20);
    peVar2 = (peVar1->m_pData).
             super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*handler->_vptr_EventHandler[7])(handler,&local_70,&peVar2->m_tag,aVar4,(ulong)peVar2->m_style)
    ;
    detail::node_data::begin
              (&local_70,
               (((node->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    detail::node_data::end
              (&local_50,
               (((node->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    break;
  case Map:
    local_70._0_8_ = (element_type *)0x0;
    local_70.m_seqIt._M_current = (node **)((ulong)local_70.m_seqIt._M_current._4_4_ << 0x20);
    peVar2 = (peVar1->m_pData).
             super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*handler->_vptr_EventHandler[9])(handler,&local_70,&peVar2->m_tag,aVar4,(ulong)peVar2->m_style)
    ;
    detail::node_data::begin
              (&local_70,
               (((node->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    detail::node_data::end
              (&local_50,
               (((node->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    do {
      if (local_70.m_type == local_50.m_type) {
        ppeVar5 = (element_type **)&local_70.m_seqIt;
        pMVar6 = (MapIter *)&local_50.m_seqIt;
        if (local_70.m_type != Sequence) {
          if (local_70.m_type != Map) {
LAB_0071e06e:
            (*handler->_vptr_EventHandler[10])(handler);
            return;
          }
          ppeVar5 = (element_type **)&local_70.m_mapIt;
          pMVar6 = &local_50.m_mapIt;
        }
        if ((pair<YAML::detail::node_*,_YAML::detail::node_*> *)*ppeVar5 == pMVar6->_M_current)
        goto LAB_0071e06e;
      }
      node_00 = (local_70.m_mapIt._M_current)->second;
      Emit(this,(local_70.m_mapIt._M_current)->first,handler,am);
      Emit(this,node_00,handler,am);
      detail::node_iterator_base<const_YAML::detail::node>::operator++(&local_70);
    } while( true );
  default:
    return;
  }
  do {
    if (local_70.m_type == local_50.m_type) {
      ppeVar5 = (element_type **)&local_70.m_seqIt;
      pMVar6 = (MapIter *)&local_50.m_seqIt;
      if (local_70.m_type != Sequence) {
        if (local_70.m_type != Map) {
LAB_0071dfaa:
          (*handler->_vptr_EventHandler[8])(handler);
          return;
        }
        ppeVar5 = (element_type **)&local_70.m_mapIt;
        pMVar6 = &local_50.m_mapIt;
      }
      if ((pair<YAML::detail::node_*,_YAML::detail::node_*> *)*ppeVar5 == pMVar6->_M_current)
      goto LAB_0071dfaa;
    }
    Emit(this,*local_70.m_seqIt._M_current,handler,am);
    detail::node_iterator_base<const_YAML::detail::node>::operator++(&local_70);
  } while( true );
}

Assistant:

void NodeEvents::Emit(const detail::node& node, EventHandler& handler,
                      AliasManager& am) const {
  anchor_t anchor = NullAnchor;
  if (IsAliased(node)) {
    anchor = am.LookupAnchor(node);
    if (anchor) {
      handler.OnAlias(Mark(), anchor);
      return;
    }

    am.RegisterReference(node);
    anchor = am.LookupAnchor(node);
  }

  switch (node.type()) {
    case NodeType::Undefined:
      break;
    case NodeType::Null:
      handler.OnNull(Mark(), anchor);
      break;
    case NodeType::Scalar:
      handler.OnScalar(Mark(), node.tag(), anchor, node.scalar());
      break;
    case NodeType::Sequence:
      handler.OnSequenceStart(Mark(), node.tag(), anchor, node.style());
      for (auto element : node)
        Emit(*element, handler, am);
      handler.OnSequenceEnd();
      break;
    case NodeType::Map:
      handler.OnMapStart(Mark(), node.tag(), anchor, node.style());
      for (auto element : node) {
        Emit(*element.first, handler, am);
        Emit(*element.second, handler, am);
      }
      handler.OnMapEnd();
      break;
  }
}